

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O3

void __thiscall wasm::SCCs<IntIt,_GraphSCCs>::stepToNextElem(SCCs<IntIt,_GraphSCCs> *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  mapped_type *pmVar3;
  
  if ((this->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    puVar2 = (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar2[-1] ==
        (this->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value) {
      (this->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged = false;
    }
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->elementInfo,puVar2 + -1);
    pmVar3->onStack = false;
    ppuVar1 = &(this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    return;
  }
  __assert_fail("currRoot",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                ,0x97,
                "void wasm::SCCs<IntIt, GraphSCCs>::stepToNextElem() [It = IntIt, Class = GraphSCCs]"
               );
}

Assistant:

void stepToNextElem() {
    assert(currRoot);
    if (stack.back() == *currRoot) {
      // This was the last element in the current SCC. We have to find the next
      // SCC now.
      currRoot = std::nullopt;
    }
    elementInfo[stack.back()].onStack = false;
    stack.pop_back();
  }